

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void sockaddr_to_netaddr(sockaddr *src,NETADDR *dst)

{
  uint16_t uVar1;
  undefined4 *in_RSI;
  ushort *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  
  if (*in_RDI == 2) {
    mem_zero(in_RSI,in_stack_ffffffffffffffec);
    *in_RSI = 1;
    uVar1 = htons(in_RDI[1]);
    *(uint16_t *)(in_RSI + 5) = uVar1;
    mem_copy(in_RSI,(void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
  }
  else if (*in_RDI == 10) {
    mem_zero(in_RSI,in_stack_ffffffffffffffec);
    *in_RSI = 2;
    uVar1 = htons(in_RDI[1]);
    *(uint16_t *)(in_RSI + 5) = uVar1;
    mem_copy(in_RSI,(void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
  }
  else {
    mem_zero(in_RSI,in_stack_ffffffffffffffec);
    dbg_msg("system","couldn\'t convert sockaddr of family %d",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static void sockaddr_to_netaddr(const struct sockaddr *src, NETADDR *dst)
{
	if(src->sa_family == AF_INET)
	{
		mem_zero(dst, sizeof(NETADDR));
		dst->type = NETTYPE_IPV4;
		dst->port = htons(((struct sockaddr_in*)src)->sin_port);
		mem_copy(dst->ip, &((struct sockaddr_in*)src)->sin_addr.s_addr, 4);
	}
	else if(src->sa_family == AF_INET6)
	{
		mem_zero(dst, sizeof(NETADDR));
		dst->type = NETTYPE_IPV6;
		dst->port = htons(((struct sockaddr_in6*)src)->sin6_port);
		mem_copy(dst->ip, &((struct sockaddr_in6*)src)->sin6_addr.s6_addr, 16);
	}
	else
	{
		mem_zero(dst, sizeof(struct sockaddr));
		dbg_msg("system", "couldn't convert sockaddr of family %d", src->sa_family);
	}
}